

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_msg_trim(nni_msg *m,size_t len)

{
  int iVar1;
  size_t len_local;
  nni_msg *m_local;
  
  iVar1 = nni_chunk_trim(&m->m_body,len);
  return iVar1;
}

Assistant:

int
nni_msg_trim(nni_msg *m, size_t len)
{
	return (nni_chunk_trim(&m->m_body, len));
}